

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tck-syntax.cc
# Opt level: O2

void do_output_json(system_declaration_t *sysdecl,string *delimiter,ostream *os)

{
  system_t *this;
  shared_ptr<tchecker::system::system_t> system;
  system_t *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  this = (system_t *)operator_new(0x348);
  tchecker::system::system_t::system_t(this,sysdecl);
  std::__shared_ptr<tchecker::system::system_t,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::system::system_t,void>
            ((__shared_ptr<tchecker::system::system_t,(__gnu_cxx::_Lock_policy)2> *)&local_30,this);
  tchecker::system::output_json(os,local_30,delimiter);
  std::endl<char,std::char_traits<char>>(os);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return;
}

Assistant:

void do_output_json(tchecker::parsing::system_declaration_t const & sysdecl, std::string const & delimiter, std::ostream & os)
{
  std::shared_ptr<tchecker::system::system_t> system(new tchecker::system::system_t(sysdecl));
  tchecker::system::output_json(os, *system, delimiter);
  os << std::endl;
}